

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFAcceleratorTable.cpp
# Opt level: O2

Optional<llvm::DWARFFormValue> * __thiscall
llvm::AppleAcceleratorTable::Entry::lookup
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,Entry *this,AtomType Atom)

{
  uint uVar1;
  HeaderData *pHVar2;
  undefined8 uVar3;
  anon_union_8_3_82d75f4a_for_ValueType_0 aVar4;
  uint8_t *puVar5;
  uint64_t uVar6;
  DWARFContext *pDVar7;
  bool bVar8;
  undefined8 *puVar9;
  long lVar10;
  
  pHVar2 = this->HdrData;
  if (pHVar2 == (HeaderData *)0x0) {
    __assert_fail("HdrData && \"Dereferencing end iterator?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x116,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  uVar1 = (pHVar2->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>.
          super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
          super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
          super_SmallVectorBase.Size;
  if (uVar1 != (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
               super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
               super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.
               Size) {
    __assert_fail("HdrData->Atoms.size() == Values.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/DWARFAcceleratorTable.cpp"
                  ,0x117,
                  "Optional<DWARFFormValue> llvm::AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType) const"
                 );
  }
  puVar9 = (undefined8 *)
           (this->super_Entry).Values.super_SmallVectorImpl<llvm::DWARFFormValue>.
           super_SmallVectorTemplateBase<llvm::DWARFFormValue,_true>.
           super_SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>.super_SmallVectorBase.BeginX;
  lVar10 = 0;
  do {
    if ((ulong)uVar1 << 2 == lVar10) {
      (__return_storage_ptr__->Storage).field_0.empty = '\0';
      bVar8 = false;
LAB_00b1afb1:
      (__return_storage_ptr__->Storage).hasVal = bVar8;
      return __return_storage_ptr__;
    }
    if (*(AtomType *)
         ((long)(pHVar2->Atoms).super_SmallVectorImpl<std::pair<unsigned_short,_llvm::dwarf::Form>_>
                .super_SmallVectorTemplateBase<std::pair<unsigned_short,_llvm::dwarf::Form>,_false>.
                super_SmallVectorTemplateCommon<std::pair<unsigned_short,_llvm::dwarf::Form>,_void>.
                super_SmallVectorBase.BeginX + lVar10) == Atom) {
      uVar3 = *puVar9;
      aVar4 = *(anon_union_8_3_82d75f4a_for_ValueType_0 *)(puVar9 + 1);
      puVar5 = (uint8_t *)puVar9[2];
      uVar6 = puVar9[3];
      pDVar7 = (DWARFContext *)puVar9[5];
      (__return_storage_ptr__->Storage).field_0.value.U = (DWARFUnit *)puVar9[4];
      (__return_storage_ptr__->Storage).field_0.value.C = pDVar7;
      (__return_storage_ptr__->Storage).field_0.value.Value.data = puVar5;
      (__return_storage_ptr__->Storage).field_0.value.Value.SectionIndex = uVar6;
      *(undefined8 *)&(__return_storage_ptr__->Storage).field_0 = uVar3;
      (__return_storage_ptr__->Storage).field_0.value.Value.field_0 = aVar4;
      bVar8 = true;
      goto LAB_00b1afb1;
    }
    puVar9 = puVar9 + 6;
    lVar10 = lVar10 + 4;
  } while( true );
}

Assistant:

Optional<DWARFFormValue>
AppleAcceleratorTable::Entry::lookup(HeaderData::AtomType Atom) const {
  assert(HdrData && "Dereferencing end iterator?");
  assert(HdrData->Atoms.size() == Values.size());
  for (const auto &Tuple : zip_first(HdrData->Atoms, Values)) {
    if (std::get<0>(Tuple).first == Atom)
      return std::get<1>(Tuple);
  }
  return None;
}